

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_decompress_safe_continue
              (LZ4_streamDecode_t *LZ4_streamDecode,char *source,char *dest,int compressedSize,
              int maxOutputSize)

{
  char cVar1;
  long lVar2;
  unsigned_long_long uVar3;
  ushort uVar4;
  ushort uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  BYTE *s_2;
  ushort *puVar8;
  char *pcVar9;
  ulong uVar10;
  char *pcVar11;
  char *pcVar12;
  uint uVar13;
  size_t sVar14;
  BYTE *d_1;
  char *pcVar15;
  ushort *puVar16;
  long lVar17;
  void *__src;
  ulong uVar18;
  char *pcVar19;
  int iVar20;
  BYTE *d;
  char *pcVar21;
  char *pcVar22;
  char *pcVar23;
  ulong uVar24;
  ulong uVar25;
  bool bVar26;
  int local_80;
  long local_78 [8];
  char *local_38;
  
  pcVar19 = (char *)LZ4_streamDecode->table[2];
  uVar25 = LZ4_streamDecode->table[3];
  puVar8 = (ushort *)(source + compressedSize);
  pcVar9 = dest + maxOutputSize;
  local_80 = (int)source;
  if (pcVar19 == dest) {
    uVar24 = LZ4_streamDecode->table[1];
    uVar3 = LZ4_streamDecode->table[0];
    local_78[2] = 0;
    local_78[4] = 0;
    local_78[0] = 0;
    local_78[1] = 0;
    local_78[3] = 0xffffffffffffffff;
    local_78[5] = 1;
    local_78[6] = 2;
    local_78[7] = 3;
    if (maxOutputSize != 0) {
      pcVar19 = pcVar19 + -uVar25;
      local_38 = pcVar9 + -8;
      pcVar23 = dest;
switchD_0015598b_caseD_0:
      uVar4 = *(ushort *)source;
      puVar16 = (ushort *)((long)source + 1);
      uVar13 = (uint)(byte)((byte)uVar4 >> 4);
      sVar14 = (size_t)uVar13;
      if (uVar13 == 0xf) {
        sVar14 = 0xf;
        do {
          uVar5 = *puVar16;
          puVar16 = (ushort *)((long)puVar16 + 1);
          sVar14 = sVar14 + (byte)uVar5;
          if ((ushort *)((long)puVar8 - 0xfU) <= puVar16) break;
        } while ((byte)uVar5 == 0xff);
        if (-1 < (long)sVar14) goto LAB_00155772;
LAB_00155844:
        source = (char *)puVar16;
        pcVar21 = pcVar23;
        uVar7 = 6;
      }
      else {
LAB_00155772:
        pcVar21 = pcVar23 + sVar14;
        source = (char *)((long)puVar16 + sVar14);
        if ((pcVar9 + -0xc < pcVar21) || (puVar8 + -4 < source)) {
          if (((ushort *)source != puVar8) || (pcVar9 < pcVar21)) goto LAB_00155844;
          memcpy(pcVar23,puVar16,sVar14);
          uVar7 = 3;
        }
        else {
          do {
            *(undefined8 *)pcVar23 = *(undefined8 *)puVar16;
            pcVar23 = pcVar23 + 8;
            puVar16 = puVar16 + 4;
          } while (pcVar23 < pcVar21);
          pcVar23 = pcVar21 + -(ulong)*(ushort *)source;
          source = (char *)((long)source + 2);
          uVar6 = 6;
          if ((0xffff < uVar24) || (uVar7 = uVar6, pcVar19 + -uVar24 <= pcVar23)) {
            uVar25 = (ulong)((byte)uVar4 & 0xf);
            if (uVar25 == 0xf) {
              uVar25 = 0xf;
              do {
                if ((ushort *)((long)puVar8 - 5U) < source) {
                  uVar7 = 6;
                  bVar26 = false;
                  goto LAB_00155853;
                }
                uVar4 = *(ushort *)source;
                source = (char *)((long)source + 1);
                uVar25 = uVar25 + (byte)uVar4;
              } while ((ulong)(byte)uVar4 == 0xff);
              bVar26 = -1 < (long)uVar25;
              uVar7 = 6;
              if (bVar26) {
                uVar7 = 0;
              }
LAB_00155853:
              if (!bVar26) goto LAB_00155979;
            }
            pcVar15 = pcVar21 + uVar25 + 4;
            if (pcVar23 < pcVar19) {
              uVar7 = uVar6;
              if (pcVar15 <= pcVar9 + -5) {
                uVar25 = uVar25 + 4;
                uVar18 = (long)pcVar19 - (long)pcVar23;
                __src = (void *)((uVar3 + uVar24) - uVar18);
                uVar10 = uVar25 - uVar18;
                if (uVar25 < uVar18 || uVar10 == 0) {
                  memmove(pcVar21,__src,uVar25);
                }
                else {
                  memcpy(pcVar21,__src,uVar18);
                  pcVar21 = pcVar21 + uVar18;
                  if ((ulong)((long)pcVar21 - (long)pcVar19) < uVar10) {
                    pcVar23 = pcVar19;
                    uVar7 = 2;
                    if ((long)uVar18 < (long)uVar25) {
                      do {
                        *pcVar21 = *pcVar23;
                        pcVar21 = pcVar21 + 1;
                        pcVar23 = pcVar23 + 1;
                        uVar7 = 2;
                      } while (pcVar21 < pcVar15);
                    }
                    goto LAB_00155979;
                  }
                  memcpy(pcVar21,pcVar19,uVar10);
                }
                pcVar21 = pcVar15;
                uVar7 = 2;
              }
            }
            else {
              lVar17 = (long)pcVar21 - (long)pcVar23;
              if (lVar17 < 8) {
                lVar2 = *(long *)(&DAT_0015b250 + lVar17 * 8);
                pcVar22 = pcVar23 + (lVar2 - local_78[lVar17]);
                *pcVar21 = *pcVar23;
                pcVar21[1] = pcVar23[1];
                pcVar21[2] = pcVar23[2];
                pcVar21[3] = pcVar23[3];
                *(undefined4 *)(pcVar21 + 4) = *(undefined4 *)(pcVar23 + lVar2);
              }
              else {
                *(undefined8 *)pcVar21 = *(undefined8 *)pcVar23;
                pcVar22 = pcVar23 + 8;
              }
              pcVar21 = pcVar21 + 8;
              if (pcVar9 + -0xc < pcVar15) {
                uVar7 = uVar6;
                if (pcVar15 <= pcVar9 + -5) {
                  pcVar23 = pcVar22;
                  pcVar11 = pcVar21;
                  if (pcVar21 < local_38) {
                    do {
                      *(undefined8 *)pcVar11 = *(undefined8 *)pcVar23;
                      pcVar11 = pcVar11 + 8;
                      pcVar23 = pcVar23 + 8;
                    } while (pcVar11 < local_38);
                    pcVar22 = pcVar22 + ((long)local_38 - (long)pcVar21);
                    pcVar11 = local_38;
                  }
                  for (; pcVar21 = pcVar15, uVar7 = 0, pcVar11 < pcVar15; pcVar11 = pcVar11 + 1) {
                    cVar1 = *pcVar22;
                    pcVar22 = pcVar22 + 1;
                    *pcVar11 = cVar1;
                  }
                }
              }
              else {
                do {
                  *(undefined8 *)pcVar21 = *(undefined8 *)pcVar22;
                  pcVar21 = pcVar21 + 8;
                  pcVar22 = pcVar22 + 8;
                } while (pcVar21 < pcVar15);
                pcVar21 = pcVar15;
                uVar7 = 0;
              }
            }
          }
        }
      }
LAB_00155979:
      pcVar23 = pcVar21;
      switch(uVar7) {
      case 0:
      case 2:
        goto switchD_0015598b_caseD_0;
      default:
        goto switchD_0015598b_caseD_1;
      case 3:
        pcVar21 = (char *)(ulong)(uint)((int)pcVar21 - (int)dest);
        goto LAB_00155a65;
      case 6:
        pcVar21 = (char *)(ulong)(~(uint)source + local_80);
        goto LAB_00155a65;
      }
    }
    pcVar21 = (char *)0xffffffff;
    if (compressedSize == 1) {
      pcVar21 = (char *)(ulong)-(uint)(*source != '\0');
    }
    goto LAB_00155a65;
  }
  LZ4_streamDecode->table[1] = uVar25;
  LZ4_streamDecode->table[0] = (long)pcVar19 - uVar25;
  local_78[2] = 0;
  local_78[4] = 0;
  local_78[0] = 0;
  local_78[1] = 0;
  local_78[3] = 0xffffffffffffffff;
  local_78[5] = 1;
  local_78[6] = 2;
  local_78[7] = 3;
  if (maxOutputSize != 0) {
    pcVar23 = pcVar9 + -8;
    pcVar21 = dest;
switchD_001555cc_caseD_0:
    uVar4 = *(ushort *)source;
    puVar16 = (ushort *)((long)source + 1);
    uVar13 = (uint)(byte)((byte)uVar4 >> 4);
    sVar14 = (size_t)uVar13;
    if (uVar13 == 0xf) {
      sVar14 = 0xf;
      do {
        uVar5 = *puVar16;
        puVar16 = (ushort *)((long)puVar16 + 1);
        sVar14 = sVar14 + (byte)uVar5;
        if ((ushort *)((long)puVar8 - 0xfU) <= puVar16) break;
      } while ((byte)uVar5 == 0xff);
      if (-1 < (long)sVar14) goto LAB_001553b4;
LAB_00155486:
      source = (char *)puVar16;
      pcVar15 = pcVar21;
      uVar7 = 6;
    }
    else {
LAB_001553b4:
      pcVar15 = pcVar21 + sVar14;
      source = (char *)((long)puVar16 + sVar14);
      if ((pcVar9 + -0xc < pcVar15) || (puVar8 + -4 < source)) {
        if (((ushort *)source != puVar8) || (pcVar9 < pcVar15)) goto LAB_00155486;
        memcpy(pcVar21,puVar16,sVar14);
        uVar7 = 3;
      }
      else {
        do {
          *(undefined8 *)pcVar21 = *(undefined8 *)puVar16;
          pcVar21 = pcVar21 + 8;
          puVar16 = puVar16 + 4;
        } while (pcVar21 < pcVar15);
        pcVar21 = pcVar15 + -(ulong)*(ushort *)source;
        source = (char *)((long)source + 2);
        uVar6 = 6;
        if ((0xffff < uVar25) || (uVar7 = uVar6, dest + -uVar25 <= pcVar21)) {
          uVar24 = (ulong)((byte)uVar4 & 0xf);
          if (uVar24 == 0xf) {
            uVar24 = 0xf;
            do {
              if ((ushort *)((long)puVar8 - 5U) < source) {
                uVar7 = 6;
                bVar26 = false;
                goto LAB_00155495;
              }
              uVar4 = *(ushort *)source;
              source = (char *)((long)source + 1);
              uVar24 = uVar24 + (byte)uVar4;
            } while ((ulong)(byte)uVar4 == 0xff);
            bVar26 = -1 < (long)uVar24;
            uVar7 = 6;
            if (bVar26) {
              uVar7 = 0;
            }
LAB_00155495:
            if (!bVar26) goto LAB_001555ba;
          }
          pcVar22 = pcVar15 + uVar24 + 4;
          if (pcVar21 < dest) {
            uVar7 = uVar6;
            if (pcVar22 <= pcVar9 + -5) {
              uVar24 = uVar24 + 4;
              uVar18 = (long)dest - (long)pcVar21;
              uVar10 = uVar24 - uVar18;
              if (uVar24 < uVar18 || uVar10 == 0) {
                memmove(pcVar15,pcVar19 + -uVar18,uVar24);
              }
              else {
                memcpy(pcVar15,pcVar19 + -uVar18,uVar18);
                pcVar15 = pcVar15 + uVar18;
                if ((ulong)((long)pcVar15 - (long)dest) < uVar10) {
                  pcVar21 = dest;
                  uVar7 = 2;
                  if ((long)uVar18 < (long)uVar24) {
                    do {
                      *pcVar15 = *pcVar21;
                      pcVar15 = pcVar15 + 1;
                      pcVar21 = pcVar21 + 1;
                      uVar7 = 2;
                    } while (pcVar15 < pcVar22);
                  }
                  goto LAB_001555ba;
                }
                memcpy(pcVar15,dest,uVar10);
              }
              pcVar15 = pcVar22;
              uVar7 = 2;
            }
          }
          else {
            lVar17 = (long)pcVar15 - (long)pcVar21;
            if (lVar17 < 8) {
              lVar2 = *(long *)(&DAT_0015b250 + lVar17 * 8);
              pcVar11 = pcVar21 + (lVar2 - local_78[lVar17]);
              *pcVar15 = *pcVar21;
              pcVar15[1] = pcVar21[1];
              pcVar15[2] = pcVar21[2];
              pcVar15[3] = pcVar21[3];
              *(undefined4 *)(pcVar15 + 4) = *(undefined4 *)(pcVar21 + lVar2);
            }
            else {
              *(undefined8 *)pcVar15 = *(undefined8 *)pcVar21;
              pcVar11 = pcVar21 + 8;
            }
            pcVar15 = pcVar15 + 8;
            if (pcVar9 + -0xc < pcVar22) {
              uVar7 = uVar6;
              if (pcVar22 <= pcVar9 + -5) {
                pcVar21 = pcVar11;
                pcVar12 = pcVar15;
                if (pcVar15 < pcVar23) {
                  do {
                    *(undefined8 *)pcVar12 = *(undefined8 *)pcVar21;
                    pcVar12 = pcVar12 + 8;
                    pcVar21 = pcVar21 + 8;
                  } while (pcVar12 < pcVar23);
                  pcVar11 = pcVar11 + ((long)pcVar23 - (long)pcVar15);
                  pcVar12 = pcVar23;
                }
                for (; pcVar15 = pcVar22, uVar7 = 0, pcVar12 < pcVar22; pcVar12 = pcVar12 + 1) {
                  cVar1 = *pcVar11;
                  pcVar11 = pcVar11 + 1;
                  *pcVar12 = cVar1;
                }
              }
            }
            else {
              do {
                *(undefined8 *)pcVar15 = *(undefined8 *)pcVar11;
                pcVar15 = pcVar15 + 8;
                pcVar11 = pcVar11 + 8;
              } while (pcVar15 < pcVar22);
              pcVar15 = pcVar22;
              uVar7 = 0;
            }
          }
        }
      }
    }
LAB_001555ba:
    pcVar21 = pcVar15;
    switch(uVar7) {
    case 0:
    case 2:
      goto switchD_001555cc_caseD_0;
    default:
      goto switchD_001555cc_caseD_1;
    case 3:
      pcVar15 = (char *)(ulong)(uint)((int)pcVar15 - (int)dest);
      goto LAB_00155a3f;
    case 6:
      pcVar15 = (char *)(ulong)(~(uint)source + local_80);
      goto LAB_00155a3f;
    }
  }
  pcVar15 = (char *)0xffffffff;
  if (compressedSize == 1) {
    pcVar15 = (char *)(ulong)-(uint)(*source != '\0');
  }
  goto LAB_00155a3f;
switchD_0015598b_caseD_1:
LAB_00155a65:
  iVar20 = (int)pcVar21;
  if (iVar20 < 1) {
    return iVar20;
  }
  LZ4_streamDecode->table[3] = LZ4_streamDecode->table[3] + ((ulong)pcVar21 & 0xffffffff);
  pcVar19 = (char *)(((ulong)pcVar21 & 0xffffffff) + LZ4_streamDecode->table[2]);
  goto LAB_00155a75;
switchD_001555cc_caseD_1:
LAB_00155a3f:
  iVar20 = (int)pcVar15;
  if (0 < iVar20) {
    LZ4_streamDecode->table[3] = (ulong)pcVar15 & 0xffffffff;
    pcVar19 = dest + ((ulong)pcVar15 & 0xffffffff);
LAB_00155a75:
    LZ4_streamDecode->table[2] = (unsigned_long_long)pcVar19;
  }
  return iVar20;
}

Assistant:

int LZ4_decompress_safe_continue (LZ4_streamDecode_t* LZ4_streamDecode, const char* source, char* dest, int compressedSize, int maxOutputSize)
{
    LZ4_streamDecode_t_internal* lz4sd = (LZ4_streamDecode_t_internal*) LZ4_streamDecode;
    int result;

    if (lz4sd->prefixEnd == (BYTE*)dest)
    {
        result = LZ4_decompress_generic(source, dest, compressedSize, maxOutputSize,
                                        endOnInputSize, full, 0,
                                        usingExtDict, lz4sd->prefixEnd - lz4sd->prefixSize, lz4sd->externalDict, lz4sd->extDictSize);
        if (result <= 0) return result;
        lz4sd->prefixSize += result;
        lz4sd->prefixEnd  += result;
    }
    else
    {
        lz4sd->extDictSize = lz4sd->prefixSize;
        lz4sd->externalDict = lz4sd->prefixEnd - lz4sd->extDictSize;
        result = LZ4_decompress_generic(source, dest, compressedSize, maxOutputSize,
                                        endOnInputSize, full, 0,
                                        usingExtDict, (BYTE*)dest, lz4sd->externalDict, lz4sd->extDictSize);
        if (result <= 0) return result;
        lz4sd->prefixSize = result;
        lz4sd->prefixEnd  = (BYTE*)dest + result;
    }

    return result;
}